

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall
indigox::utils::
Graph<indigox::NTDVertProp,_indigox::utils::NoProperty,_indigox::utils::DirectedGraph>::Graph
          (Graph<indigox::NTDVertProp,_indigox::utils::NoProperty,_indigox::utils::DirectedGraph>
           *this)

{
  allocator_type local_12;
  allocator_type local_11;
  
  std::
  make_shared<boost::adjacency_list<boost::setS,boost::listS,boost::bidirectionalS,indigox::NTDVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>>
            ();
  this->next_edge_id_ = 0;
  this->next_vert_id_ = 0;
  boost::bimaps::bimap<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::bimap
            (&this->vert_idxmap_,&local_11);
  boost::bimaps::
  bimap<boost::detail::edge_desc_impl<boost::bidirectional_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>
  ::bimap(&this->edge_idxmap_,&local_12);
  return;
}

Assistant:

Graph() : graph_(std::make_shared<T>())
      {}